

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseAlphaHull(SelectionCompiler *this)

{
  int iVar1;
  bool bVar2;
  any alpha;
  Token tokenAlpha;
  any local_78;
  Token local_60;
  Token local_48;
  Token local_30;
  
  tokenNext(&local_30,this);
  std::any::reset(&local_30.value);
  tokenNext(&local_60,this);
  iVar1 = local_60.tok;
  std::any::reset(&local_60.value);
  if (iVar1 == 0x400) {
    local_78._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_78._M_storage._M_ptr = (void *)0x0;
    tokenNext(&local_60,this);
    if ((local_60.tok & 0xfffffffeU) == 2) {
      std::any::operator=(&local_78,&local_60.value);
      tokenNext(&local_48,this);
      std::any::reset(&local_48.value);
      if (local_48.tok == 0x401) {
        Token::Token(&local_48,0x140d,&local_78);
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                  (&this->ltokenPostfix,&local_48);
        std::any::reset(&local_48.value);
        bVar2 = true;
      }
      else {
        bVar2 = rightParenthesisExpected(this);
      }
    }
    else {
      bVar2 = numberOrKeywordExpected(this);
    }
    std::any::reset(&local_60.value);
    std::any::reset(&local_78);
  }
  else {
    bVar2 = leftParenthesisExpected(this);
  }
  return bVar2;
}

Assistant:

bool SelectionCompiler::clauseAlphaHull() {
    tokenNext();                                // alphaHull
    if (tokenNext().tok != Token::leftparen) {  // (
      return leftParenthesisExpected();
    }

    std::any alpha;
    Token tokenAlpha = tokenNext();  // alpha
    switch (tokenAlpha.tok) {
    case Token::integer:
    case Token::decimal:
      alpha = tokenAlpha.value;
      break;
    default:
      return numberOrKeywordExpected();
    }

    if (tokenNext().tok != Token::rightparen) {  // )T
      return rightParenthesisExpected();
    }

    return addTokenToPostfix(Token(Token::alphahull, alpha));
  }